

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_fast.c
# Opt level: O1

size_t ZSTD_compressBlock_fast_extDict_generic
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize,
                 U32 mls)

{
  long *plVar1;
  ulong *iEnd;
  undefined8 *puVar2;
  ulong *puVar3;
  BYTE *pBVar4;
  BYTE *pBVar5;
  U32 *pUVar6;
  seqDef *psVar7;
  undefined8 uVar8;
  bool bVar9;
  char cVar10;
  U32 maxDistance;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  ulong *puVar14;
  size_t sVar15;
  byte bVar16;
  byte bVar17;
  uint uVar18;
  ulong uVar19;
  ulong *puVar20;
  uint uVar21;
  int *piVar22;
  int *piVar23;
  int *piVar24;
  uint uVar25;
  BYTE *litEnd_1;
  ulong *puVar26;
  BYTE *pBVar27;
  BYTE *pBVar28;
  ulong uVar29;
  ulong *puVar30;
  long lVar31;
  long lVar32;
  ulong *puVar33;
  ulong uVar34;
  int iVar35;
  BYTE *pInLoopLimit;
  U32 UVar36;
  uint uVar37;
  BYTE *pStart;
  ulong uVar38;
  U32 UVar39;
  BYTE *litEnd;
  ulong uVar40;
  ulong *puVar41;
  int iVar42;
  int iVar43;
  BYTE *pBVar44;
  ulong uVar45;
  BYTE *base;
  BYTE *litLimit_w;
  BYTE *litLimit_w_1;
  
  uVar11 = (ms->cParams).targetLength;
  uVar11 = uVar11 + (uVar11 == 0);
  pBVar5 = (ms->window).base;
  iEnd = (ulong *)((long)src + srcSize);
  uVar12 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  iVar42 = (int)pBVar5;
  iVar35 = (int)iEnd - iVar42;
  uVar21 = (ms->window).lowLimit;
  uVar37 = uVar21;
  if (uVar12 < iVar35 - uVar21) {
    uVar37 = iVar35 - uVar12;
  }
  UVar39 = ms->loadedDictEnd;
  if (UVar39 != 0) {
    uVar37 = uVar21;
  }
  pUVar6 = ms->hashTable;
  puVar3 = (ulong *)((long)src + (srcSize - 8));
  uVar21 = (ms->window).dictLimit;
  uVar13 = *rep;
  uVar25 = rep[1];
  cVar10 = (char)(ms->cParams).hashLog;
  if (uVar37 < uVar21) {
    if (src < puVar3) {
      pBVar44 = (ms->window).dictBase;
      piVar23 = (int *)(pBVar5 + uVar21);
      puVar26 = (ulong *)(pBVar44 + uVar21);
      bVar16 = 0x40 - cVar10;
      bVar17 = 0x20 - cVar10;
      puVar14 = iEnd + -4;
      puVar41 = (ulong *)src;
      do {
        iVar35 = mls - 5;
        switch(iVar35) {
        case 0:
          lVar31 = -0x30e4432345000000;
          break;
        case 1:
          lVar31 = -0x30e4432340650000;
          break;
        case 2:
          lVar31 = -0x30e44323405a9d00;
          break;
        case 3:
          uVar19 = *puVar41 * -0x30e44323485a9b9d;
          goto LAB_006f466e;
        default:
          uVar19 = (ulong)((uint)((int)*puVar41 * -0x61c8864f) >> (bVar17 & 0x1f));
          goto LAB_006f4676;
        }
        uVar19 = lVar31 * *puVar41;
LAB_006f466e:
        uVar19 = uVar19 >> (bVar16 & 0x3f);
LAB_006f4676:
        uVar12 = pUVar6[uVar19];
        pBVar28 = pBVar5;
        if (uVar12 < uVar21) {
          pBVar28 = pBVar44;
        }
        uVar38 = (long)puVar41 - (long)pBVar5;
        UVar39 = (U32)uVar38;
        uVar18 = (UVar39 + 1) - uVar13;
        pBVar27 = pBVar5;
        if (uVar18 < uVar21) {
          pBVar27 = pBVar44;
        }
        pUVar6[uVar19] = UVar39;
        if (((uVar13 < (UVar39 + 1) - uVar37) && (2 < (uVar21 - 1) - uVar18)) &&
           (*(int *)(pBVar27 + uVar18) == *(int *)((long)puVar41 + 1))) {
          puVar20 = (ulong *)((long)puVar41 + 1);
          puVar30 = iEnd;
          if (uVar18 < uVar21) {
            puVar30 = puVar26;
          }
          sVar15 = ZSTD_count_2segments
                             ((BYTE *)((long)puVar41 + 5),(BYTE *)((long)(pBVar27 + uVar18) + 4),
                              (BYTE *)iEnd,(BYTE *)puVar30,(BYTE *)piVar23);
          uVar19 = (long)puVar20 - (long)src;
          if (puVar14 < puVar20) {
            puVar30 = (ulong *)seqStore->lit;
            puVar41 = puVar30;
            puVar33 = (ulong *)src;
            if (src <= puVar14) {
              puVar41 = (ulong *)((long)puVar30 + ((long)puVar14 - (long)src));
              uVar34 = *(ulong *)((long)src + 8);
              *puVar30 = *src;
              puVar30[1] = uVar34;
              puVar33 = puVar14;
              if (0x10 < (long)puVar14 - (long)src) {
                lVar31 = 0x10;
                do {
                  uVar8 = *(undefined8 *)((BYTE *)((long)src + lVar31) + 8);
                  puVar2 = (undefined8 *)((long)puVar30 + lVar31);
                  *puVar2 = *(undefined8 *)((long)src + lVar31);
                  puVar2[1] = uVar8;
                  pBVar28 = (BYTE *)((long)src + lVar31 + 0x10);
                  uVar8 = *(undefined8 *)(pBVar28 + 8);
                  puVar2[2] = *(undefined8 *)pBVar28;
                  puVar2[3] = uVar8;
                  lVar31 = lVar31 + 0x20;
                } while (puVar2 + 4 < puVar41);
              }
            }
            if (puVar33 < puVar20) {
              lVar31 = 0;
              do {
                *(BYTE *)((long)puVar41 + lVar31) = *(BYTE *)((long)puVar33 + lVar31);
                lVar31 = lVar31 + 1;
              } while ((long)puVar20 - (long)puVar33 != lVar31);
            }
          }
          else {
            puVar41 = (ulong *)seqStore->lit;
            uVar34 = *(ulong *)((long)src + 8);
            *puVar41 = *src;
            puVar41[1] = uVar34;
            if (0x10 < uVar19) {
              pBVar28 = seqStore->lit;
              uVar34 = *(ulong *)((long)src + 0x18);
              *(ulong *)(pBVar28 + 0x10) = *(ulong *)((long)src + 0x10);
              *(ulong *)(pBVar28 + 0x18) = uVar34;
              if (0x20 < (long)uVar19) {
                lVar31 = 0;
                do {
                  pBVar4 = (BYTE *)((long)src + lVar31 + 0x20);
                  uVar8 = *(undefined8 *)(pBVar4 + 8);
                  pBVar27 = pBVar28 + lVar31 + 0x20;
                  *(undefined8 *)pBVar27 = *(undefined8 *)pBVar4;
                  *(undefined8 *)(pBVar27 + 8) = uVar8;
                  pBVar4 = (BYTE *)((long)src + lVar31 + 0x30);
                  uVar8 = *(undefined8 *)(pBVar4 + 8);
                  *(undefined8 *)(pBVar27 + 0x10) = *(undefined8 *)pBVar4;
                  *(undefined8 *)(pBVar27 + 0x18) = uVar8;
                  lVar31 = lVar31 + 0x20;
                } while (pBVar27 + 0x20 < pBVar28 + uVar19);
              }
            }
          }
          seqStore->lit = seqStore->lit + uVar19;
          if (0xffff < uVar19) {
            seqStore->longLengthType = ZSTD_llt_literalLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
          }
          psVar7 = seqStore->sequences;
          psVar7->litLength = (U16)uVar19;
          psVar7->offset = 1;
          if (0xffff < sVar15 + 1) {
            seqStore->longLengthType = ZSTD_llt_matchLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar7 - (long)seqStore->sequencesStart) >> 3);
          }
          psVar7->matchLength = (U16)(sVar15 + 1);
          seqStore->sequences = psVar7 + 1;
          src = (void *)((long)puVar20 + sVar15 + 4);
          uVar12 = uVar13;
LAB_006f4b38:
          puVar41 = (ulong *)src;
          uVar13 = uVar12;
          if (puVar3 < src) goto LAB_006f4b42;
          uVar38 = uVar38 & 0xffffffff;
          switch(iVar35) {
          case 0:
            lVar31 = -0x30e4432345000000;
            break;
          case 1:
            lVar31 = -0x30e4432340650000;
            break;
          case 2:
            lVar31 = -0x30e44323405a9d00;
            break;
          case 3:
            uVar19 = *(long *)(pBVar5 + uVar38 + 2) * -0x30e44323485a9b9d;
            goto LAB_006f4bbe;
          default:
            uVar19 = (ulong)((uint)(*(int *)(pBVar5 + uVar38 + 2) * -0x61c8864f) >> (bVar17 & 0x1f))
            ;
            goto LAB_006f4bc6;
          }
          uVar19 = lVar31 * *(long *)(pBVar5 + uVar38 + 2);
LAB_006f4bbe:
          uVar19 = uVar19 >> (bVar16 & 0x3f);
LAB_006f4bc6:
          pUVar6[uVar19] = UVar39 + 2;
          plVar1 = (long *)((long)src + -2);
          switch(iVar35) {
          case 0:
            lVar31 = -0x30e4432345000000;
            break;
          case 1:
            lVar31 = -0x30e4432340650000;
            break;
          case 2:
            lVar31 = -0x30e44323405a9d00;
            break;
          case 3:
            uVar19 = *plVar1 * -0x30e44323485a9b9d;
            goto LAB_006f4c41;
          default:
            uVar19 = (ulong)((uint)(*(int *)plVar1 * -0x61c8864f) >> (bVar17 & 0x1f));
            goto LAB_006f4c49;
          }
          uVar19 = lVar31 * *plVar1;
LAB_006f4c41:
          uVar19 = uVar19 >> (bVar16 & 0x3f);
LAB_006f4c49:
          pUVar6[uVar19] = (int)plVar1 - iVar42;
          do {
            uVar13 = uVar12;
            if (puVar3 < puVar41) break;
            UVar36 = (int)puVar41 - iVar42;
            uVar13 = UVar36 - uVar25;
            pBVar28 = pBVar5;
            if (uVar13 < uVar21) {
              pBVar28 = pBVar44;
            }
            if (((uVar25 < UVar39 - uVar37) && (2 < (uVar21 - 1) - uVar13)) &&
               (*(int *)(pBVar28 + uVar13) == (int)*puVar41)) {
              puVar20 = iEnd;
              if (uVar13 < uVar21) {
                puVar20 = puVar26;
              }
              sVar15 = ZSTD_count_2segments
                                 ((BYTE *)((long)puVar41 + 4),(BYTE *)((long)(pBVar28 + uVar13) + 4)
                                  ,(BYTE *)iEnd,(BYTE *)puVar20,(BYTE *)piVar23);
              if (src <= puVar14) {
                puVar20 = (ulong *)seqStore->lit;
                uVar19 = *(ulong *)((long)src + 8);
                *puVar20 = *src;
                puVar20[1] = uVar19;
              }
              psVar7 = seqStore->sequences;
              psVar7->litLength = 0;
              psVar7->offset = 1;
              if (0xffff < sVar15 + 1) {
                seqStore->longLengthType = ZSTD_llt_matchLength;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar7 - (long)seqStore->sequencesStart) >> 3);
              }
              psVar7->matchLength = (U16)(sVar15 + 1);
              seqStore->sequences = psVar7 + 1;
              switch(iVar35) {
              case 0:
                lVar31 = -0x30e4432345000000;
                break;
              case 1:
                lVar31 = -0x30e4432340650000;
                break;
              case 2:
                lVar31 = -0x30e44323405a9d00;
                break;
              case 3:
                uVar19 = *puVar41 * -0x30e44323485a9b9d;
                goto LAB_006f4dae;
              default:
                uVar19 = (ulong)((uint)((int)*puVar41 * -0x61c8864f) >> (bVar17 & 0x1f));
                goto LAB_006f4db6;
              }
              uVar19 = lVar31 * *puVar41;
LAB_006f4dae:
              uVar19 = uVar19 >> (bVar16 & 0x3f);
LAB_006f4db6:
              pUVar6[uVar19] = UVar36;
              src = (void *)((long)puVar41 + sVar15 + 4);
              bVar9 = true;
              puVar41 = (ulong *)src;
              uVar13 = uVar25;
              uVar25 = uVar12;
            }
            else {
              bVar9 = false;
              uVar13 = uVar12;
            }
            uVar12 = uVar13;
            uVar13 = uVar12;
          } while (bVar9);
        }
        else {
          if ((uVar37 <= uVar12) && (piVar22 = (int *)(pBVar28 + uVar12), *piVar22 == (int)*puVar41)
             ) {
            piVar24 = piVar23;
            puVar20 = iEnd;
            if (uVar12 < uVar21) {
              piVar24 = (int *)(pBVar44 + uVar37);
              puVar20 = puVar26;
            }
            sVar15 = ZSTD_count_2segments
                               ((BYTE *)((long)puVar41 + 4),(BYTE *)(piVar22 + 1),(BYTE *)iEnd,
                                (BYTE *)puVar20,(BYTE *)piVar23);
            lVar31 = sVar15 + 4;
            if ((piVar24 < piVar22) && (src < puVar41)) {
              piVar22 = (int *)(pBVar28 + uVar12);
              do {
                piVar22 = (int *)((long)piVar22 + -1);
                puVar20 = (ulong *)((long)puVar41 + -1);
                if ((*(BYTE *)puVar20 != *(BYTE *)piVar22) ||
                   (lVar31 = lVar31 + 1, puVar41 = puVar20, piVar22 <= piVar24)) break;
              } while (src < puVar20);
            }
            uVar19 = (long)puVar41 - (long)src;
            if (puVar14 < puVar41) {
              puVar30 = (ulong *)seqStore->lit;
              puVar20 = puVar30;
              puVar33 = (ulong *)src;
              if (src <= puVar14) {
                puVar20 = (ulong *)((long)puVar30 + ((long)puVar14 - (long)src));
                uVar34 = *(ulong *)((long)src + 8);
                *puVar30 = *src;
                puVar30[1] = uVar34;
                puVar33 = puVar14;
                if (0x10 < (long)puVar14 - (long)src) {
                  lVar32 = 0x10;
                  do {
                    uVar8 = *(undefined8 *)((BYTE *)((long)src + lVar32) + 8);
                    puVar2 = (undefined8 *)((long)puVar30 + lVar32);
                    *puVar2 = *(undefined8 *)((long)src + lVar32);
                    puVar2[1] = uVar8;
                    pBVar28 = (BYTE *)((long)src + lVar32 + 0x10);
                    uVar8 = *(undefined8 *)(pBVar28 + 8);
                    puVar2[2] = *(undefined8 *)pBVar28;
                    puVar2[3] = uVar8;
                    lVar32 = lVar32 + 0x20;
                  } while (puVar2 + 4 < puVar20);
                }
              }
              if (puVar33 < puVar41) {
                lVar32 = 0;
                do {
                  *(BYTE *)((long)puVar20 + lVar32) = *(BYTE *)((long)puVar33 + lVar32);
                  lVar32 = lVar32 + 1;
                } while ((long)puVar41 - (long)puVar33 != lVar32);
              }
            }
            else {
              puVar20 = (ulong *)seqStore->lit;
              uVar34 = *(ulong *)((long)src + 8);
              *puVar20 = *src;
              puVar20[1] = uVar34;
              if (0x10 < uVar19) {
                pBVar28 = seqStore->lit;
                uVar34 = *(ulong *)((long)src + 0x18);
                *(ulong *)(pBVar28 + 0x10) = *(ulong *)((long)src + 0x10);
                *(ulong *)(pBVar28 + 0x18) = uVar34;
                if (0x20 < (long)uVar19) {
                  lVar32 = 0;
                  do {
                    pBVar4 = (BYTE *)((long)src + lVar32 + 0x20);
                    uVar8 = *(undefined8 *)(pBVar4 + 8);
                    pBVar27 = pBVar28 + lVar32 + 0x20;
                    *(undefined8 *)pBVar27 = *(undefined8 *)pBVar4;
                    *(undefined8 *)(pBVar27 + 8) = uVar8;
                    pBVar4 = (BYTE *)((long)src + lVar32 + 0x30);
                    uVar8 = *(undefined8 *)(pBVar4 + 8);
                    *(undefined8 *)(pBVar27 + 0x10) = *(undefined8 *)pBVar4;
                    *(undefined8 *)(pBVar27 + 0x18) = uVar8;
                    lVar32 = lVar32 + 0x20;
                  } while (pBVar27 + 0x20 < pBVar28 + uVar19);
                }
              }
            }
            seqStore->lit = seqStore->lit + uVar19;
            if (0xffff < uVar19) {
              seqStore->longLengthType = ZSTD_llt_literalLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
            }
            uVar12 = UVar39 - uVar12;
            psVar7 = seqStore->sequences;
            psVar7->litLength = (U16)uVar19;
            psVar7->offset = uVar12 + 3;
            if (0xffff < lVar31 - 3U) {
              seqStore->longLengthType = ZSTD_llt_matchLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar7 - (long)seqStore->sequencesStart) >> 3);
            }
            psVar7->matchLength = (U16)(lVar31 - 3U);
            seqStore->sequences = psVar7 + 1;
            src = (void *)((long)puVar41 + lVar31);
            uVar25 = uVar13;
            goto LAB_006f4b38;
          }
          puVar41 = (ulong *)((long)puVar41 + ((long)puVar41 - (long)src >> 8) + (ulong)uVar11);
        }
LAB_006f4b42:
      } while (puVar41 < puVar3);
    }
    *rep = uVar13;
  }
  else {
    uVar37 = iVar35 - uVar12;
    if (iVar35 - uVar21 <= uVar12) {
      uVar37 = uVar21;
    }
    if (UVar39 != 0) {
      uVar37 = uVar21;
    }
    piVar23 = (int *)(pBVar5 + uVar37);
    puVar26 = (ulong *)((long)src + (ulong)(piVar23 == (int *)src));
    iVar35 = (int)puVar26 - iVar42;
    uVar18 = iVar35 - uVar12;
    if (iVar35 - uVar21 <= uVar12) {
      uVar18 = uVar21;
    }
    if (UVar39 != 0) {
      uVar18 = uVar21;
    }
    uVar18 = iVar35 - uVar18;
    uVar21 = 0;
    if (uVar18 < uVar25) {
      uVar21 = uVar25;
    }
    puVar41 = (ulong *)((long)src + (ulong)(piVar23 == (int *)src) + 1);
    if (uVar18 < uVar25) {
      uVar25 = 0;
    }
    uVar12 = uVar13;
    if (uVar18 < uVar13) {
      uVar12 = 0;
      uVar21 = uVar13;
    }
    uVar19 = (ulong)uVar12;
    if (puVar41 < puVar3) {
      bVar16 = 0x40 - cVar10;
      bVar17 = 0x20 - cVar10;
      puVar14 = (ulong *)((long)iEnd - 7);
      puVar20 = iEnd + -4;
      do {
        iVar35 = mls - 5;
        switch(iVar35) {
        case 0:
          lVar31 = -0x30e4432345000000;
          break;
        case 1:
          lVar31 = -0x30e4432340650000;
          break;
        case 2:
          lVar31 = -0x30e44323405a9d00;
          break;
        case 3:
          uVar38 = *puVar26 * -0x30e44323485a9b9d;
          goto LAB_006f4f5c;
        default:
          uVar38 = (ulong)((uint)((int)*puVar26 * -0x61c8864f) >> (bVar17 & 0x1f));
          goto LAB_006f4f63;
        }
        uVar38 = lVar31 * *puVar26;
LAB_006f4f5c:
        uVar38 = uVar38 >> (bVar16 & 0x3f);
LAB_006f4f63:
        switch(iVar35) {
        case 0:
          lVar31 = -0x30e4432345000000;
          break;
        case 1:
          lVar31 = -0x30e4432340650000;
          break;
        case 2:
          lVar31 = -0x30e44323405a9d00;
          break;
        case 3:
          uVar34 = *puVar41 * -0x30e44323485a9b9d;
          goto LAB_006f4fcb;
        default:
          uVar34 = (ulong)((uint)((int)*puVar41 * -0x61c8864f) >> (bVar17 & 0x1f));
          goto LAB_006f4fd2;
        }
        uVar34 = lVar31 * *puVar41;
LAB_006f4fcb:
        uVar34 = uVar34 >> (bVar16 & 0x3f);
LAB_006f4fd2:
        uVar29 = *puVar26;
        uVar45 = *puVar41;
        uVar40 = (long)puVar26 - (long)pBVar5;
        uVar12 = pUVar6[uVar38];
        uVar13 = pUVar6[uVar34];
        UVar39 = (U32)uVar40;
        pUVar6[uVar38] = UVar39;
        pUVar6[uVar34] = (int)puVar41 - iVar42;
        uVar18 = (uint)uVar19;
        if ((uVar18 == 0) || (*(int *)((long)puVar26 + (2 - uVar19)) != *(int *)((long)puVar26 + 2))
           ) {
          if (((uVar37 < uVar12) &&
              (piVar22 = (int *)(pBVar5 + uVar12), puVar30 = puVar26, *piVar22 == (int)uVar29)) ||
             ((uVar37 < uVar13 &&
              (piVar22 = (int *)(pBVar5 + uVar13), puVar30 = puVar41, *piVar22 == (int)uVar45)))) {
            uVar12 = (int)puVar30 - (int)piVar22;
            uVar19 = (ulong)uVar12;
            iVar43 = uVar12 + 2;
            uVar38 = 4;
            if (piVar23 < piVar22) {
              while (src < puVar30) {
                piVar24 = (int *)((long)piVar22 + -1);
                puVar26 = (ulong *)((long)puVar30 + -1);
                if ((*(BYTE *)puVar26 != *(BYTE *)piVar24) ||
                   (uVar38 = uVar38 + 1, puVar30 = puVar26, piVar22 = piVar24, piVar24 <= piVar23))
                break;
              }
            }
            goto LAB_006f5120;
          }
          lVar31 = ((ulong)((long)puVar26 - (long)src) >> 7) + (ulong)(uVar11 + 1);
          puVar26 = (ulong *)((long)puVar26 + lVar31);
          puVar41 = (ulong *)((long)puVar41 + lVar31);
        }
        else {
          uVar34 = (ulong)(*(BYTE *)((long)puVar26 + 1) == *(BYTE *)((long)puVar26 + -uVar19 + 1));
          uVar38 = uVar34 | 4;
          iVar43 = 0;
          puVar30 = (ulong *)((long)puVar26 + (2 - uVar34));
          piVar22 = (int *)((long)puVar26 + ((-uVar19 + 2) - uVar34));
          uVar18 = uVar25;
LAB_006f5120:
          puVar26 = (ulong *)(uVar38 + (long)puVar30);
          puVar33 = (ulong *)((long)piVar22 + uVar38);
          puVar41 = puVar26;
          if (puVar26 < puVar14) {
            uVar29 = *puVar26 ^ *puVar33;
            uVar34 = 0;
            if (uVar29 != 0) {
              for (; (uVar29 >> uVar34 & 1) == 0; uVar34 = uVar34 + 1) {
              }
            }
            pBVar44 = (BYTE *)(uVar34 >> 3 & 0x1fffffff);
            if (*puVar33 == *puVar26) {
              do {
                puVar41 = puVar41 + 1;
                puVar33 = puVar33 + 1;
                if (puVar14 <= puVar41) goto LAB_006f518d;
                uVar29 = *puVar41 ^ *puVar33;
                uVar34 = 0;
                if (uVar29 != 0) {
                  for (; (uVar29 >> uVar34 & 1) == 0; uVar34 = uVar34 + 1) {
                  }
                }
                pBVar44 = (BYTE *)((long)puVar41 + ((uVar34 >> 3 & 0x1fffffff) - (long)puVar26));
              } while (*puVar33 == *puVar41);
            }
          }
          else {
LAB_006f518d:
            if ((puVar41 < (ulong *)((long)iEnd - 3U)) && ((int)*puVar33 == (int)*puVar41)) {
              puVar41 = (ulong *)((long)puVar41 + 4);
              puVar33 = (ulong *)((long)puVar33 + 4);
            }
            if ((puVar41 < (ulong *)((long)iEnd - 1U)) && ((short)*puVar33 == (short)*puVar41)) {
              puVar41 = (ulong *)((long)puVar41 + 2);
              puVar33 = (ulong *)((long)puVar33 + 2);
            }
            if (puVar41 < iEnd) {
              puVar41 = (ulong *)((long)puVar41 + (ulong)((BYTE)*puVar33 == (BYTE)*puVar41));
            }
            pBVar44 = (BYTE *)((long)puVar41 - (long)puVar26);
          }
          uVar34 = (long)puVar30 - (long)src;
          if (puVar20 < puVar30) {
            puVar41 = (ulong *)seqStore->lit;
            puVar26 = puVar41;
            puVar33 = (ulong *)src;
            if (src <= puVar20) {
              puVar26 = (ulong *)((long)puVar41 + ((long)puVar20 - (long)src));
              uVar29 = *(ulong *)((long)src + 8);
              *puVar41 = *src;
              puVar41[1] = uVar29;
              puVar33 = puVar20;
              if (0x10 < (long)puVar20 - (long)src) {
                lVar31 = 0x10;
                do {
                  uVar8 = *(undefined8 *)((BYTE *)((long)src + lVar31) + 8);
                  puVar2 = (undefined8 *)((long)puVar41 + lVar31);
                  *puVar2 = *(undefined8 *)((long)src + lVar31);
                  puVar2[1] = uVar8;
                  pBVar28 = (BYTE *)((long)src + lVar31 + 0x10);
                  uVar8 = *(undefined8 *)(pBVar28 + 8);
                  puVar2[2] = *(undefined8 *)pBVar28;
                  puVar2[3] = uVar8;
                  lVar31 = lVar31 + 0x20;
                } while (puVar2 + 4 < puVar26);
              }
            }
            if (puVar33 < puVar30) {
              lVar31 = 0;
              do {
                *(BYTE *)((long)puVar26 + lVar31) = *(BYTE *)((long)puVar33 + lVar31);
                lVar31 = lVar31 + 1;
              } while ((long)puVar30 - (long)puVar33 != lVar31);
            }
          }
          else {
            puVar26 = (ulong *)seqStore->lit;
            uVar29 = *(ulong *)((long)src + 8);
            *puVar26 = *src;
            puVar26[1] = uVar29;
            if (0x10 < uVar34) {
              pBVar28 = seqStore->lit;
              uVar29 = *(ulong *)((long)src + 0x18);
              *(ulong *)(pBVar28 + 0x10) = *(ulong *)((long)src + 0x10);
              *(ulong *)(pBVar28 + 0x18) = uVar29;
              if (0x20 < (long)uVar34) {
                lVar31 = 0;
                do {
                  pBVar4 = (BYTE *)((long)src + lVar31 + 0x20);
                  uVar8 = *(undefined8 *)(pBVar4 + 8);
                  pBVar27 = pBVar28 + lVar31 + 0x20;
                  *(undefined8 *)pBVar27 = *(undefined8 *)pBVar4;
                  *(undefined8 *)(pBVar27 + 8) = uVar8;
                  pBVar4 = (BYTE *)((long)src + lVar31 + 0x30);
                  uVar8 = *(undefined8 *)(pBVar4 + 8);
                  *(undefined8 *)(pBVar27 + 0x10) = *(undefined8 *)pBVar4;
                  *(undefined8 *)(pBVar27 + 0x18) = uVar8;
                  lVar31 = lVar31 + 0x20;
                } while (pBVar27 + 0x20 < pBVar28 + uVar34);
              }
            }
          }
          seqStore->lit = seqStore->lit + uVar34;
          if (0xffff < uVar34) {
            seqStore->longLengthType = ZSTD_llt_literalLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
          }
          psVar7 = seqStore->sequences;
          psVar7->litLength = (U16)uVar34;
          psVar7->offset = iVar43 + 1;
          if ((BYTE *)0xffff < pBVar44 + (uVar38 - 3)) {
            seqStore->longLengthType = ZSTD_llt_matchLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar7 - (long)seqStore->sequencesStart) >> 3);
          }
          psVar7->matchLength = (U16)(pBVar44 + (uVar38 - 3));
          seqStore->sequences = psVar7 + 1;
          puVar26 = (ulong *)((long)puVar30 + (long)(pBVar44 + uVar38));
          if (puVar26 <= puVar3) {
            uVar40 = uVar40 & 0xffffffff;
            switch(iVar35) {
            case 0:
              lVar31 = -0x30e4432345000000;
              break;
            case 1:
              lVar31 = -0x30e4432340650000;
              break;
            case 2:
              lVar31 = -0x30e44323405a9d00;
              break;
            case 3:
              uVar38 = *(long *)(pBVar5 + uVar40 + 2) * -0x30e44323485a9b9d;
              goto LAB_006f53d4;
            default:
              uVar38 = (ulong)((uint)(*(int *)(pBVar5 + uVar40 + 2) * -0x61c8864f) >>
                              (bVar17 & 0x1f));
              goto LAB_006f53db;
            }
            uVar38 = lVar31 * *(long *)(pBVar5 + uVar40 + 2);
LAB_006f53d4:
            uVar38 = uVar38 >> (bVar16 & 0x3f);
LAB_006f53db:
            pUVar6[uVar38] = UVar39 + 2;
            plVar1 = (long *)((long)puVar26 + -2);
            switch(iVar35) {
            case 0:
              lVar31 = -0x30e4432345000000;
              break;
            case 1:
              lVar31 = -0x30e4432340650000;
              break;
            case 2:
              lVar31 = -0x30e44323405a9d00;
              break;
            case 3:
              uVar38 = *plVar1 * -0x30e44323485a9b9d;
              goto LAB_006f5453;
            default:
              uVar38 = (ulong)((uint)(*(int *)plVar1 * -0x61c8864f) >> (bVar17 & 0x1f));
              goto LAB_006f545a;
            }
            uVar38 = lVar31 * *plVar1;
LAB_006f5453:
            uVar38 = uVar38 >> (bVar16 & 0x3f);
LAB_006f545a:
            pUVar6[uVar38] = (int)plVar1 - iVar42;
            if (uVar18 == 0) {
              uVar18 = 0;
            }
            else {
              for (; puVar26 <= puVar3; puVar26 = (ulong *)((long)puVar26 + (long)(pBVar44 + 4))) {
                uVar38 = (ulong)uVar18;
                uVar12 = (uint)uVar19;
                if ((int)*puVar26 != *(int *)((long)puVar26 - uVar38)) break;
                puVar41 = (ulong *)((long)puVar26 + 4);
                puVar33 = (ulong *)((long)puVar26 + (4 - uVar38));
                puVar30 = puVar41;
                if (puVar41 < puVar14) {
                  uVar34 = *puVar41 ^ *puVar33;
                  uVar19 = 0;
                  if (uVar34 != 0) {
                    for (; (uVar34 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
                    }
                  }
                  pBVar44 = (BYTE *)(uVar19 >> 3 & 0x1fffffff);
                  if (*puVar33 == *puVar41) {
                    puVar30 = (ulong *)((long)puVar26 + 0xc);
                    puVar33 = (ulong *)((long)puVar26 + (0xc - uVar38));
                    do {
                      if (puVar14 <= puVar30) goto LAB_006f5522;
                      uVar19 = *puVar33;
                      uVar34 = *puVar30;
                      uVar45 = uVar34 ^ uVar19;
                      uVar29 = 0;
                      if (uVar45 != 0) {
                        for (; (uVar45 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
                        }
                      }
                      pBVar44 = (BYTE *)((long)puVar30 +
                                        ((uVar29 >> 3 & 0x1fffffff) - (long)puVar41));
                      puVar30 = puVar30 + 1;
                      puVar33 = puVar33 + 1;
                    } while (uVar19 == uVar34);
                  }
                }
                else {
LAB_006f5522:
                  if ((puVar30 < (ulong *)((long)iEnd - 3U)) && ((int)*puVar33 == (int)*puVar30)) {
                    puVar30 = (ulong *)((long)puVar30 + 4);
                    puVar33 = (ulong *)((long)puVar33 + 4);
                  }
                  if ((puVar30 < (ulong *)((long)iEnd - 1U)) && ((short)*puVar33 == (short)*puVar30)
                     ) {
                    puVar30 = (ulong *)((long)puVar30 + 2);
                    puVar33 = (ulong *)((long)puVar33 + 2);
                  }
                  if (puVar30 < iEnd) {
                    puVar30 = (ulong *)((long)puVar30 + (ulong)((BYTE)*puVar33 == (BYTE)*puVar30));
                  }
                  pBVar44 = (BYTE *)((long)puVar30 - (long)puVar41);
                }
                switch(iVar35) {
                case 0:
                  lVar31 = -0x30e4432345000000;
                  break;
                case 1:
                  lVar31 = -0x30e4432340650000;
                  break;
                case 2:
                  lVar31 = -0x30e44323405a9d00;
                  break;
                case 3:
                  uVar19 = *puVar26 * -0x30e44323485a9b9d;
                  goto LAB_006f55d6;
                default:
                  uVar19 = (ulong)((uint)((int)*puVar26 * -0x61c8864f) >> (bVar17 & 0x1f));
                  goto LAB_006f55dd;
                }
                uVar19 = lVar31 * *puVar26;
LAB_006f55d6:
                uVar19 = uVar19 >> (bVar16 & 0x3f);
LAB_006f55dd:
                pUVar6[uVar19] = (int)puVar26 - iVar42;
                if (puVar26 <= puVar20) {
                  puVar41 = (ulong *)seqStore->lit;
                  uVar19 = puVar26[1];
                  *puVar41 = *puVar26;
                  puVar41[1] = uVar19;
                }
                psVar7 = seqStore->sequences;
                psVar7->litLength = 0;
                psVar7->offset = 1;
                if ((BYTE *)0xffff < pBVar44 + 1) {
                  seqStore->longLengthType = ZSTD_llt_matchLength;
                  seqStore->longLengthPos =
                       (U32)((ulong)((long)psVar7 - (long)seqStore->sequencesStart) >> 3);
                }
                psVar7->matchLength = (U16)(pBVar44 + 1);
                seqStore->sequences = psVar7 + 1;
                uVar19 = uVar38;
                uVar18 = uVar12;
              }
            }
          }
          puVar41 = (ulong *)((long)puVar26 + 1);
          src = puVar26;
          uVar25 = uVar18;
        }
        uVar12 = (uint)uVar19;
      } while (puVar41 < puVar3);
    }
    if (uVar12 == 0) {
      uVar12 = uVar21;
    }
    *rep = uVar12;
    if (uVar25 == 0) {
      uVar25 = uVar21;
    }
  }
  rep[1] = uVar25;
  return (long)iEnd - (long)src;
}

Assistant:

static size_t ZSTD_compressBlock_fast_extDict_generic(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize, U32 const mls)
{
    const ZSTD_compressionParameters* const cParams = &ms->cParams;
    U32* const hashTable = ms->hashTable;
    U32 const hlog = cParams->hashLog;
    /* support stepSize of 0 */
    U32 const stepSize = cParams->targetLength + !(cParams->targetLength);
    const BYTE* const base = ms->window.base;
    const BYTE* const dictBase = ms->window.dictBase;
    const BYTE* const istart = (const BYTE*)src;
    const BYTE* ip = istart;
    const BYTE* anchor = istart;
    const U32   endIndex = (U32)((size_t)(istart - base) + srcSize);
    const U32   lowLimit = ZSTD_getLowestMatchIndex(ms, endIndex, cParams->windowLog);
    const U32   dictStartIndex = lowLimit;
    const BYTE* const dictStart = dictBase + dictStartIndex;
    const U32   dictLimit = ms->window.dictLimit;
    const U32   prefixStartIndex = dictLimit < lowLimit ? lowLimit : dictLimit;
    const BYTE* const prefixStart = base + prefixStartIndex;
    const BYTE* const dictEnd = dictBase + prefixStartIndex;
    const BYTE* const iend = istart + srcSize;
    const BYTE* const ilimit = iend - 8;
    U32 offset_1=rep[0], offset_2=rep[1];

    DEBUGLOG(5, "ZSTD_compressBlock_fast_extDict_generic (offset_1=%u)", offset_1);

    /* switch to "regular" variant if extDict is invalidated due to maxDistance */
    if (prefixStartIndex == dictStartIndex)
        return ZSTD_compressBlock_fast_generic(ms, seqStore, rep, src, srcSize, mls);

    /* Search Loop */
    while (ip < ilimit) {  /* < instead of <=, because (ip+1) */
        const size_t h = ZSTD_hashPtr(ip, hlog, mls);
        const U32    matchIndex = hashTable[h];
        const BYTE* const matchBase = matchIndex < prefixStartIndex ? dictBase : base;
        const BYTE*  match = matchBase + matchIndex;
        const U32    curr = (U32)(ip-base);
        const U32    repIndex = curr + 1 - offset_1;
        const BYTE* const repBase = repIndex < prefixStartIndex ? dictBase : base;
        const BYTE* const repMatch = repBase + repIndex;
        hashTable[h] = curr;   /* update hash table */
        DEBUGLOG(7, "offset_1 = %u , curr = %u", offset_1, curr);

        if ( ( ((U32)((prefixStartIndex-1) - repIndex) >= 3) /* intentional underflow */
             & (offset_1 < curr+1 - dictStartIndex) ) /* note: we are searching at curr+1 */
           && (MEM_read32(repMatch) == MEM_read32(ip+1)) ) {
            const BYTE* const repMatchEnd = repIndex < prefixStartIndex ? dictEnd : iend;
            size_t const rLength = ZSTD_count_2segments(ip+1 +4, repMatch +4, iend, repMatchEnd, prefixStart) + 4;
            ip++;
            ZSTD_storeSeq(seqStore, (size_t)(ip-anchor), anchor, iend, 0, rLength-MINMATCH);
            ip += rLength;
            anchor = ip;
        } else {
            if ( (matchIndex < dictStartIndex) ||
                 (MEM_read32(match) != MEM_read32(ip)) ) {
                assert(stepSize >= 1);
                ip += ((ip-anchor) >> kSearchStrength) + stepSize;
                continue;
            }
            {   const BYTE* const matchEnd = matchIndex < prefixStartIndex ? dictEnd : iend;
                const BYTE* const lowMatchPtr = matchIndex < prefixStartIndex ? dictStart : prefixStart;
                U32 const offset = curr - matchIndex;
                size_t mLength = ZSTD_count_2segments(ip+4, match+4, iend, matchEnd, prefixStart) + 4;
                while (((ip>anchor) & (match>lowMatchPtr)) && (ip[-1] == match[-1])) { ip--; match--; mLength++; }   /* catch up */
                offset_2 = offset_1; offset_1 = offset;  /* update offset history */
                ZSTD_storeSeq(seqStore, (size_t)(ip-anchor), anchor, iend, offset + ZSTD_REP_MOVE, mLength-MINMATCH);
                ip += mLength;
                anchor = ip;
        }   }

        if (ip <= ilimit) {
            /* Fill Table */
            hashTable[ZSTD_hashPtr(base+curr+2, hlog, mls)] = curr+2;
            hashTable[ZSTD_hashPtr(ip-2, hlog, mls)] = (U32)(ip-2-base);
            /* check immediate repcode */
            while (ip <= ilimit) {
                U32 const current2 = (U32)(ip-base);
                U32 const repIndex2 = current2 - offset_2;
                const BYTE* const repMatch2 = repIndex2 < prefixStartIndex ? dictBase + repIndex2 : base + repIndex2;
                if ( (((U32)((prefixStartIndex-1) - repIndex2) >= 3) & (offset_2 < curr - dictStartIndex))  /* intentional overflow */
                   && (MEM_read32(repMatch2) == MEM_read32(ip)) ) {
                    const BYTE* const repEnd2 = repIndex2 < prefixStartIndex ? dictEnd : iend;
                    size_t const repLength2 = ZSTD_count_2segments(ip+4, repMatch2+4, iend, repEnd2, prefixStart) + 4;
                    { U32 const tmpOffset = offset_2; offset_2 = offset_1; offset_1 = tmpOffset; }  /* swap offset_2 <=> offset_1 */
                    ZSTD_storeSeq(seqStore, 0 /*litlen*/, anchor, iend, 0 /*offcode*/, repLength2-MINMATCH);
                    hashTable[ZSTD_hashPtr(ip, hlog, mls)] = current2;
                    ip += repLength2;
                    anchor = ip;
                    continue;
                }
                break;
    }   }   }

    /* save reps for next block */
    rep[0] = offset_1;
    rep[1] = offset_2;

    /* Return the last literals size */
    return (size_t)(iend - anchor);
}